

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void skip_intra_modes_in_interframe
               (AV1_COMMON *cm,macroblock *x,BLOCK_SIZE bsize,InterModeSearchState *search_state,
               SPEED_FEATURES *sf,int64_t inter_cost,int64_t intra_cost)

{
  undefined4 uVar1;
  int16_t iVar2;
  int iVar3;
  long in_RCX;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  float thresh [5];
  int ac_q_max;
  int ac_q;
  float scores [2];
  float nn_features [6];
  NN_CONFIG *nn_config;
  int ind;
  int qindex_thresh [2];
  int skip_intra_in_interframe;
  uint src_var_thresh_intra_skip;
  int mv_thresh;
  MV best_mv;
  int comp_pred;
  MACROBLOCKD *xd;
  aom_bit_depth_t in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int local_ac;
  float local_a8 [8];
  int local_88;
  int local_84;
  float local_80 [3];
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  NN_CONFIG *local_60;
  uint local_58;
  int local_54 [5];
  undefined4 local_40;
  uint local_3c;
  long local_38;
  long local_30;
  long local_20;
  byte local_11;
  long local_10;
  long local_8;
  
  local_38 = in_RSI + 0x1a0;
  local_3c = (uint)('\0' < *(char *)(in_RCX + 0x29));
  if (((*(char *)(in_R8 + 0x4c8) != '\0') && (*(byte *)(in_R8 + 0xe4) < in_DL)) && (local_3c == 0))
  {
    uVar1 = *(undefined4 *)(in_RCX + 0x20);
    local_54[4] = 0x10 << (*(byte *)(in_R8 + 0x4c8) & 0x1f);
    local_40._0_2_ = (short)uVar1;
    iVar3 = (int)(short)local_40;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    local_40 = uVar1;
    if (iVar3 < local_54[4]) {
      local_40._2_2_ = (short)((uint)uVar1 >> 0x10);
      iVar3 = (int)local_40._2_2_;
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      if ((iVar3 < local_54[4]) && (0x80 < *(uint *)(in_RSI + 0x25640))) {
        *(undefined4 *)(in_RCX + 0x31fc) = 1;
        return;
      }
    }
  }
  local_54[3] = 1;
  local_54[2] = *(int *)(in_R8 + 0x2c4);
  if (local_54[2] == 0) {
    return;
  }
  if (1 < *(uint *)(in_RSI + 0x25640)) {
    local_30 = in_R9;
    local_20 = in_RCX;
    local_11 = in_DL;
    local_8 = in_RDI;
    if ((1 < local_54[2]) && (*(char *)(in_RCX + 0xa8) != '\0')) {
      local_54[0] = 200;
      local_54[1] = 0xff;
      local_58 = (uint)(2 < local_54[2]);
      local_10 = in_RSI;
      iVar3 = have_newmv_in_inter_mode(*(PREDICTION_MODE *)(in_RCX + 0x1a));
      if ((iVar3 == 0) && (*(int *)(local_10 + 0x4208) <= local_54[(int)local_58])) {
        *(undefined4 *)(local_20 + 0x31fc) = 1;
        return;
      }
      if ((3 < local_54[2]) && ((local_30 < 0 || (in_stack_00000008 < 0)))) {
        *(undefined4 *)(local_20 + 0x31fc) = 1;
        return;
      }
    }
    if ((-1 < local_30) && (-1 < in_stack_00000008)) {
      if (*(int *)(local_8 + 0x38) < *(int *)(local_8 + 0x3c)) {
        local_ac = *(int *)(local_8 + 0x38);
      }
      else {
        local_ac = *(int *)(local_8 + 0x3c);
      }
      local_60 = &av1_intrap_hd_nn_config;
      if (local_ac < 0x1e1) {
        local_60 = &av1_intrap_nn_config;
      }
      local_80[0] = 0.0;
      local_80[1] = 0.0;
      local_80[2] = (float)*(byte *)(local_20 + 0xa8);
      local_74 = (float)""[local_11];
      local_70 = (float)""[local_11];
      local_6c = (float)in_stack_00000008;
      local_68 = (float)local_30;
      iVar2 = av1_ac_quant_QTX(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                               in_stack_ffffffffffffff48);
      local_84 = (int)iVar2;
      iVar2 = av1_ac_quant_QTX(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                               in_stack_ffffffffffffff48);
      local_88 = (int)iVar2;
      local_64 = (float)(local_88 / local_84);
      (*av1_nn_predict)(local_80 + 2,local_60,1,local_80);
      local_a8[0] = 1.4;
      local_a8[1] = 1.4;
      local_a8[2] = 1.4;
      local_a8[3] = 1.4;
      local_a8[4] = 1.4;
      if (local_80[0] + local_a8[local_54[2] + -1] < local_80[1]) {
        *(undefined4 *)(local_20 + 0x31fc) = 1;
      }
    }
    return;
  }
  return;
}

Assistant:

static inline void skip_intra_modes_in_interframe(
    AV1_COMMON *const cm, struct macroblock *x, BLOCK_SIZE bsize,
    InterModeSearchState *search_state, const SPEED_FEATURES *const sf,
    int64_t inter_cost, int64_t intra_cost) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const int comp_pred = search_state->best_mbmode.ref_frame[1] > INTRA_FRAME;
  if (sf->rt_sf.prune_intra_mode_based_on_mv_range &&
      bsize > sf->part_sf.max_intra_bsize && !comp_pred) {
    const MV best_mv = search_state->best_mbmode.mv[0].as_mv;
    const int mv_thresh = 16 << sf->rt_sf.prune_intra_mode_based_on_mv_range;
    if (abs(best_mv.row) < mv_thresh && abs(best_mv.col) < mv_thresh &&
        x->source_variance > 128) {
      search_state->intra_search_state.skip_intra_modes = 1;
      return;
    }
  }

  const unsigned int src_var_thresh_intra_skip = 1;
  const int skip_intra_in_interframe = sf->intra_sf.skip_intra_in_interframe;
  if (!(skip_intra_in_interframe &&
        (x->source_variance > src_var_thresh_intra_skip)))
    return;

  // Prune intra search based on best inter mode being transfrom skip.
  if ((skip_intra_in_interframe >= 2) && search_state->best_mbmode.skip_txfm) {
    const int qindex_thresh[2] = { 200, MAXQ };
    const int ind = (skip_intra_in_interframe >= 3) ? 1 : 0;
    if (!have_newmv_in_inter_mode(search_state->best_mbmode.mode) &&
        (x->qindex <= qindex_thresh[ind])) {
      search_state->intra_search_state.skip_intra_modes = 1;
      return;
    } else if ((skip_intra_in_interframe >= 4) &&
               (inter_cost < 0 || intra_cost < 0)) {
      search_state->intra_search_state.skip_intra_modes = 1;
      return;
    }
  }
  // Use ML model to prune intra search.
  if (inter_cost >= 0 && intra_cost >= 0) {
    const NN_CONFIG *nn_config = (AOMMIN(cm->width, cm->height) <= 480)
                                     ? &av1_intrap_nn_config
                                     : &av1_intrap_hd_nn_config;
    float nn_features[6];
    float scores[2] = { 0.0f };

    nn_features[0] = (float)search_state->best_mbmode.skip_txfm;
    nn_features[1] = (float)mi_size_wide_log2[bsize];
    nn_features[2] = (float)mi_size_high_log2[bsize];
    nn_features[3] = (float)intra_cost;
    nn_features[4] = (float)inter_cost;
    const int ac_q = av1_ac_quant_QTX(x->qindex, 0, xd->bd);
    const int ac_q_max = av1_ac_quant_QTX(255, 0, xd->bd);
    nn_features[5] = (float)(ac_q_max / ac_q);

    av1_nn_predict(nn_features, nn_config, 1, scores);

    // For two parameters, the max prob returned from av1_nn_softmax equals
    // 1.0 / (1.0 + e^(-|diff_score|)). Here use scores directly to avoid the
    // calling of av1_nn_softmax.
    const float thresh[5] = { 1.4f, 1.4f, 1.4f, 1.4f, 1.4f };
    assert(skip_intra_in_interframe <= 5);
    if (scores[1] > scores[0] + thresh[skip_intra_in_interframe - 1]) {
      search_state->intra_search_state.skip_intra_modes = 1;
    }
  }
}